

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool pugi::impl::anon_unknown_0::strequal(char_t *src,char_t *dst)

{
  int iVar1;
  
  if ((src != (char_t *)0x0) && (dst != (char_t *)0x0)) {
    iVar1 = strcmp((char *)src,(char *)dst);
    return iVar1 == 0;
  }
  __assert_fail("src && dst",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                ,0xe2,
                "bool pugi::impl::(anonymous namespace)::strequal(const char_t *, const char_t *)");
}

Assistant:

PUGI__FN bool strequal(const char_t* src, const char_t* dst)
	{
		assert(src && dst);

	#ifdef PUGIXML_WCHAR_MODE
		return wcscmp(src, dst) == 0;
	#else
		return strcmp(src, dst) == 0;
	#endif
	}